

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void parse_block(LexState *ls)

{
  undefined1 local_28 [8];
  FuncScope bl;
  FuncState *fs;
  LexState *ls_local;
  
  bl._8_8_ = ls->fs;
  fscope_begin((FuncState *)bl._8_8_,(FuncScope *)local_28,0);
  parse_chunk(ls);
  fscope_end((FuncState *)bl._8_8_);
  return;
}

Assistant:

static void parse_block(LexState *ls)
{
  FuncState *fs = ls->fs;
  FuncScope bl;
  fscope_begin(fs, &bl, 0);
  parse_chunk(ls);
  fscope_end(fs);
}